

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_binary_packed_decoder.cpp
# Opt level: O1

void __thiscall duckdb::DeltaBinaryPackedDecoder::InitializePage(DeltaBinaryPackedDecoder *this)

{
  uint64_t *puVar1;
  _Head_base<0UL,_duckdb::DbpDecoder_*,_false> _Var2;
  uint64_t req_len;
  ResizeableBuffer *pRVar3;
  ResizeableBuffer *pRVar4;
  _Head_base<0UL,_duckdb::DbpDecoder_*,_false> this_00;
  shared_ptr<duckdb::ResizeableBuffer,_true> *this_01;
  
  this_01 = &this->reader->block;
  pRVar3 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
  pRVar4 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
  this_00._M_head_impl = (DbpDecoder *)operator_new(0x170);
  DbpDecoder::DbpDecoder
            (this_00._M_head_impl,(pRVar3->super_ByteBuffer).ptr,
             (uint32_t)(pRVar4->super_ByteBuffer).len);
  _Var2._M_head_impl =
       (this->dbp_decoder).
       super_unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>.
       super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl;
  (this->dbp_decoder).super_unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>
  ._M_t.super___uniq_ptr_impl<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>.
  super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var2._M_head_impl != (DbpDecoder *)0x0) {
    operator_delete(_Var2._M_head_impl);
  }
  pRVar3 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
  pRVar4 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
  req_len = (pRVar4->super_ByteBuffer).len;
  ByteBuffer::available(&pRVar3->super_ByteBuffer,req_len);
  puVar1 = &(pRVar3->super_ByteBuffer).len;
  *puVar1 = *puVar1 - req_len;
  (pRVar3->super_ByteBuffer).ptr = (pRVar3->super_ByteBuffer).ptr + req_len;
  return;
}

Assistant:

void DeltaBinaryPackedDecoder::InitializePage() {
	auto &block = reader.block;
	dbp_decoder = make_uniq<DbpDecoder>(block->ptr, block->len);
	block->inc(block->len);
}